

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::GenericDataEssenceDescriptor::GenericDataEssenceDescriptor
          (GenericDataEssenceDescriptor *this,GenericDataEssenceDescriptor *rhs)

{
  byte_t *value;
  UL local_48;
  GenericDataEssenceDescriptor *local_18;
  GenericDataEssenceDescriptor *rhs_local;
  GenericDataEssenceDescriptor *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  FileDescriptor::FileDescriptor
            (&this->super_FileDescriptor,
             (rhs->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.m_Dict);
  (this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
  _vptr_KLVPacket = (_func_int **)&PTR__GenericDataEssenceDescriptor_0033af78;
  UL::UL(&this->DataEssenceCoding);
  if ((this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.m_Dict !=
      (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_FileDescriptor).super_GenericDescriptor.
                           super_InterchangeObject.m_Dict,MDD_GenericDataEssenceDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                   super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    (*(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
      _vptr_KLVPacket[0x15])(this,local_18);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xc85,
                "ASDCP::MXF::GenericDataEssenceDescriptor::GenericDataEssenceDescriptor(const GenericDataEssenceDescriptor &)"
               );
}

Assistant:

GenericDataEssenceDescriptor::GenericDataEssenceDescriptor(const GenericDataEssenceDescriptor& rhs) : FileDescriptor(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_GenericDataEssenceDescriptor);
  Copy(rhs);
}